

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall despot::Parser::ParseVariableTag(Parser *this,TiXmlHandle *xml_handle)

{
  pointer pNVar1;
  int iVar2;
  long lVar3;
  TiXmlNode *this_00;
  TiXmlElement *e_StateVar;
  long *plVar4;
  mapped_type *ppVVar5;
  ulong uVar6;
  size_type *psVar7;
  char *pcVar8;
  Parser *this_01;
  pointer pSVar9;
  pointer pNVar10;
  ulong uVar11;
  bool condition;
  string type;
  NamedVar reward;
  StateVar curr_state;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  long *local_258 [2];
  long local_248 [2];
  string local_238;
  long *local_218 [2];
  long local_208 [2];
  vector<despot::NamedVar,_std::allocator<despot::NamedVar>_> *local_1f8;
  vector<despot::NamedVar,_std::allocator<despot::NamedVar>_> *local_1f0;
  vector<despot::NamedVar,_std::allocator<despot::NamedVar>_> *local_1e8;
  vector<despot::StateVar,_std::allocator<despot::StateVar>_> *local_1e0;
  vector<despot::StateVar,_std::allocator<despot::StateVar>_> *local_1d8;
  string local_1d0;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [104];
  _Alloc_hider local_138;
  size_type local_130;
  _Alloc_hider local_118;
  size_type local_110;
  undefined1 local_f0 [192];
  
  util::tinyxml::TiXmlHandle::FirstChild((TiXmlHandle *)local_f0,(char *)xml_handle);
  util::tinyxml::TiXmlHandle::FirstChild((TiXmlHandle *)local_1b0,(char *)local_f0);
  if (((TiXmlNode *)local_1b0._0_8_ == (TiXmlNode *)0x0) ||
     (lVar3 = (**(code **)(*(long *)local_1b0._0_8_ + 0x58))(), lVar3 == 0)) {
    this_00 = (TiXmlNode *)0x0;
  }
  else {
    this_00 = (TiXmlNode *)(**(code **)(*(long *)local_1b0._0_8_ + 0x58))();
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d0,"Cannot find Variable tag","");
  Ensure(this,this_00 != (TiXmlNode *)0x0,&local_1d0,(TiXmlBase *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  e_StateVar = util::tinyxml::TiXmlNode::FirstChildElement(this_00);
  if (e_StateVar != (TiXmlElement *)0x0) {
    local_1f8 = &this->reward_vars_;
    local_1f0 = &this->action_vars_;
    local_1e8 = &this->obs_vars_;
    local_1d8 = &this->prev_state_vars_;
    local_1e0 = &this->curr_state_vars_;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,((e_StateVar->super_TiXmlNode).value.rep_)->str,
                 (allocator<char> *)local_1b0);
      pcVar8 = "StateVar";
      iVar2 = std::__cxx11::string::compare((char *)&local_298);
      if (iVar2 == 0) {
        CreateStateVar((StateVar *)local_1b0,(Parser *)pcVar8,e_StateVar);
        local_218[0] = local_208;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_218,local_138._M_p,local_138._M_p + local_130);
        std::__cxx11::string::_M_assign((string *)(local_1a0 + 0x48));
        if (local_218[0] != local_208) {
          operator_delete(local_218[0],local_208[0] + 1);
        }
        std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::push_back
                  (local_1d8,(StateVar *)local_1b0);
        StateVar::StateVar((StateVar *)local_f0,(StateVar *)local_1b0);
        local_258[0] = local_248;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_258,local_118._M_p,local_118._M_p + local_110);
        std::__cxx11::string::_M_assign((string *)(local_f0 + 0x58));
        if (local_258[0] != local_248) {
          operator_delete(local_258[0],local_248[0] + 1);
        }
        std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::push_back
                  (local_1e0,(value_type *)local_f0);
        StateVar::~StateVar((StateVar *)local_f0);
        StateVar::~StateVar((StateVar *)local_1b0);
      }
      else {
        pcVar8 = "ObsVar";
        iVar2 = std::__cxx11::string::compare((char *)&local_298);
        if (iVar2 == 0) {
          CreateObsVar((NamedVar *)local_1b0,(Parser *)pcVar8,e_StateVar);
          std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::push_back
                    (local_1e8,(NamedVar *)local_1b0);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_298);
          if (iVar2 == 0) {
            pNVar10 = (this->action_vars_).
                      super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pNVar1 = (this->action_vars_).
                     super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl
                     .super__Vector_impl_data._M_finish;
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_238,"Only one action variable is allowed!","");
            condition = pNVar1 == pNVar10;
            this_01 = (Parser *)(ulong)condition;
            Ensure(this,condition,&local_238,(TiXmlBase *)0x0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              this_01 = (Parser *)(local_238.field_2._M_allocated_capacity + 1);
              operator_delete(local_238._M_dataplus._M_p,(ulong)this_01);
            }
            CreateActionVar((NamedVar *)local_1b0,this_01,e_StateVar);
            std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::push_back
                      (local_1f0,(NamedVar *)local_1b0);
          }
          else {
            pcVar8 = "RewardVar";
            iVar2 = std::__cxx11::string::compare((char *)&local_298);
            if (iVar2 != 0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b0,"Unknown XML tag: ",&local_298);
              plVar4 = (long *)std::__cxx11::string::append((char *)local_1b0);
              local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
              psVar7 = (size_type *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_278.field_2._M_allocated_capacity = *psVar7;
                local_278.field_2._8_8_ = plVar4[3];
              }
              else {
                local_278.field_2._M_allocated_capacity = *psVar7;
                local_278._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_278._M_string_length = plVar4[1];
              *plVar4 = (long)psVar7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              Ensure(this,false,&local_278,(TiXmlBase *)e_StateVar);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_dataplus._M_p != &local_278.field_2) {
                operator_delete(local_278._M_dataplus._M_p,
                                local_278.field_2._M_allocated_capacity + 1);
              }
              if ((TiXmlNode *)local_1b0._0_8_ != (TiXmlNode *)local_1a0) {
                operator_delete((void *)local_1b0._0_8_,local_1a0._0_8_ + 1);
              }
              goto LAB_0014c227;
            }
            CreateRewardVar((NamedVar *)local_1b0,(Parser *)pcVar8,e_StateVar);
            std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::push_back
                      (local_1f8,(NamedVar *)local_1b0);
          }
        }
        NamedVar::~NamedVar((NamedVar *)local_1b0);
      }
LAB_0014c227:
      e_StateVar = util::tinyxml::TiXmlNode::NextSiblingElement(&e_StateVar->super_TiXmlNode);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
    } while (e_StateVar != (TiXmlElement *)0x0);
  }
  pSVar9 = (this->prev_state_vars_).
           super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->prev_state_vars_).
      super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar9) {
    lVar3 = 0x58;
    uVar11 = 0;
    do {
      ppVVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                ::operator[](&this->variables_,
                             (key_type *)
                             ((long)&(pSVar9->super_NamedVar).super_Variable._vptr_Variable + lVar3)
                            );
      *ppVVar5 = (mapped_type)((long)pSVar9 + lVar3 + -0x58);
      uVar11 = uVar11 + 1;
      pSVar9 = (this->prev_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->prev_state_vars_).
                     super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)pSVar9 >> 6) * -0x5555555555555555;
      lVar3 = lVar3 + 0xc0;
    } while (uVar11 <= uVar6 && uVar6 - uVar11 != 0);
  }
  pSVar9 = (this->curr_state_vars_).
           super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->curr_state_vars_).
      super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar9) {
    lVar3 = 0x58;
    uVar11 = 0;
    do {
      ppVVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                ::operator[](&this->variables_,
                             (key_type *)
                             ((long)&(pSVar9->super_NamedVar).super_Variable._vptr_Variable + lVar3)
                            );
      *ppVVar5 = (mapped_type)((long)pSVar9 + lVar3 + -0x58);
      uVar11 = uVar11 + 1;
      pSVar9 = (this->curr_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->curr_state_vars_).
                     super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)pSVar9 >> 6) * -0x5555555555555555;
      lVar3 = lVar3 + 0xc0;
    } while (uVar11 <= uVar6 && uVar6 - uVar11 != 0);
  }
  pNVar10 = (this->obs_vars_).
            super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
      _M_impl.super__Vector_impl_data._M_finish != pNVar10) {
    lVar3 = 0x58;
    uVar11 = 0;
    do {
      ppVVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                ::operator[](&this->variables_,
                             (key_type *)((long)&(pNVar10->super_Variable)._vptr_Variable + lVar3));
      *ppVVar5 = (mapped_type)((long)pNVar10 + lVar3 + -0x58);
      uVar11 = uVar11 + 1;
      pNVar10 = (this->obs_vars_).
                super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->obs_vars_).
                     super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)pNVar10 >> 3) * -0x1111111111111111;
      lVar3 = lVar3 + 0x78;
    } while (uVar11 <= uVar6 && uVar6 - uVar11 != 0);
  }
  pNVar10 = (this->action_vars_).
            super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
      _M_impl.super__Vector_impl_data._M_finish != pNVar10) {
    lVar3 = 0x58;
    uVar11 = 0;
    do {
      ppVVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                ::operator[](&this->variables_,
                             (key_type *)((long)&(pNVar10->super_Variable)._vptr_Variable + lVar3));
      *ppVVar5 = (mapped_type)((long)pNVar10 + lVar3 + -0x58);
      uVar11 = uVar11 + 1;
      pNVar10 = (this->action_vars_).
                super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->action_vars_).
                     super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)pNVar10 >> 3) * -0x1111111111111111;
      lVar3 = lVar3 + 0x78;
    } while (uVar11 <= uVar6 && uVar6 - uVar11 != 0);
  }
  pNVar10 = (this->reward_vars_).
            super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->reward_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
      _M_impl.super__Vector_impl_data._M_finish != pNVar10) {
    lVar3 = 0x58;
    uVar11 = 0;
    do {
      ppVVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                ::operator[](&this->variables_,
                             (key_type *)((long)&(pNVar10->super_Variable)._vptr_Variable + lVar3));
      *ppVVar5 = (mapped_type)((long)pNVar10 + lVar3 + -0x58);
      uVar11 = uVar11 + 1;
      pNVar10 = (this->reward_vars_).
                super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->reward_vars_).
                     super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)pNVar10 >> 3) * -0x1111111111111111;
      lVar3 = lVar3 + 0x78;
    } while (uVar11 <= uVar6 && uVar6 - uVar11 != 0);
  }
  return;
}

Assistant:

void Parser::ParseVariableTag(TiXmlHandle& xml_handle) {
	TiXmlElement* e_Variable = xml_handle.FirstChild("pomdpx").FirstChild(
		"Variable").ToElement();

	Ensure(e_Variable != NULL, "Cannot find Variable tag");

	TiXmlElement* e_Var = e_Variable->FirstChildElement();
	while (e_Var != 0) {
		string type = e_Var->Value();
		if (type == "StateVar") {
			StateVar prev_state = CreateStateVar(e_Var);
			prev_state.name(prev_state.prev_name());
			prev_state_vars_.push_back(prev_state);

			StateVar curr_state = prev_state;
			curr_state.name(prev_state.curr_name());
			curr_state_vars_.push_back(curr_state);
		} else if (type == "ObsVar") {
			ObsVar obs = CreateObsVar(e_Var);
			obs_vars_.push_back(obs);
		} else if (type == "ActionVar") {
			Ensure(action_vars_.size() == 0,
				"Only one action variable is allowed!");

			ActionVar act = CreateActionVar(e_Var);
			action_vars_.push_back(act);
		} else if (type == "RewardVar") {
			RewardVar reward = CreateRewardVar(e_Var);
			reward_vars_.push_back(reward);
		} else {
			Ensure(false, "Unknown XML tag: " + type + " encountered", e_Var);
		}

		e_Var = e_Var->NextSiblingElement();
	}

	for (int i = 0; i < prev_state_vars_.size(); i++) {
		StateVar& var = prev_state_vars_[i];
		variables_[var.name()] = &var;
	}
	for (int i = 0; i < curr_state_vars_.size(); i++) {
		StateVar& var = curr_state_vars_[i];
		variables_[var.name()] = &var;
	}

	for (int i = 0; i < obs_vars_.size(); i++) {
		ObsVar& var = obs_vars_[i];
		variables_[var.name()] = &var;
	}

	for (int i = 0; i < action_vars_.size(); i++) {
		ActionVar& var = action_vars_[i];
		variables_[var.name()] = &var;
	}

	for (int i = 0; i < reward_vars_.size(); i++) {
		RewardVar& var = reward_vars_[i];
		variables_[var.name()] = &var;
	}
}